

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O2

single_learner * LEARNER::as_singleline<char,char>(learner<char,_char> *l)

{
  vw_exception *this;
  string local_1c0;
  stringstream __msg;
  ostream local_190;
  
  if (l[0xe8] == (learner<char,_char>)0x0) {
    return (single_learner *)l;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  std::operator<<(&local_190,"Tried to use a multiline reduction as a singleline reduction");
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/learner.h"
             ,0x1d1,&local_1c0);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

single_learner* as_singleline(learner<T, E>* l)
{
  if (!l->is_multiline)  // Tried to use a multiline reduction as a singleline reduction
    return (single_learner*)(l);
  THROW("Tried to use a multiline reduction as a singleline reduction");
}